

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TagDeclaration_Enum.h
# Opt level: O2

void __thiscall psy::C::EnumDeclarationSymbol::~EnumDeclarationSymbol(EnumDeclarationSymbol *this)

{
  TagDeclarationSymbol::~TagDeclarationSymbol(&this->super_TagDeclarationSymbol);
  operator_delete(this,0x28);
  return;
}

Assistant:

class PSY_C_API EnumDeclarationSymbol final : public TagDeclarationSymbol
{
public:
    //!@{
    /**
     * Cast \c this Symbol as a EnumDeclarationSymbol.
     */
    virtual EnumDeclarationSymbol* asEnumDeclaration() override { return this; }
    virtual const EnumDeclarationSymbol* asEnumDeclaration() const override { return this; }
    //!@}

PSY_INTERNAL:
    PSY_GRANT_INTERNAL_ACCESS(DeclarationBinder);

    EnumDeclarationSymbol(
            const Symbol* containingSym,
            const SyntaxTree* tree,
            const Scope* enclosingScope,
            TagType* tagTy);

    void addEnumerator(const EnumeratorDeclarationSymbol* enumerator);
}